

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O3

int lws_role_call_alpn_negotiated(lws *wsi,char *alpn)

{
  int iVar1;
  lws_log_cx *cx;
  lws_role_ops **pplVar2;
  lws_role_ops *plVar3;
  
  if (alpn != (char *)0x0) {
    cx = lwsl_wsi_get_cx(wsi);
    _lws_log_cx(cx,lws_log_prepend_wsi,wsi,8,"lws_role_call_alpn_negotiated","\'%s\'",alpn);
    if (available_roles[0] != (lws_role_ops *)0x0) {
      pplVar2 = available_roles;
      plVar3 = available_roles[0];
      do {
        pplVar2 = pplVar2 + 1;
        if (plVar3->alpn != (char *)0x0) {
          iVar1 = strcmp(plVar3->alpn,alpn);
          if (iVar1 == 0) {
            if (0xf < plVar3->rops_idx[6]) {
              iVar1 = (*plVar3->rops_table[(plVar3->rops_idx[6] >> 4) - 1].check_upgrades)(wsi);
              return iVar1;
            }
          }
        }
        plVar3 = *pplVar2;
      } while (plVar3 != (lws_role_ops *)0x0);
    }
  }
  return 0;
}

Assistant:

int
lws_role_call_alpn_negotiated(struct lws *wsi, const char *alpn)
{
#if defined(LWS_WITH_TLS)
	if (!alpn)
		return 0;

#if !defined(LWS_ESP_PLATFORM)
	lwsl_wsi_info(wsi, "'%s'", alpn);
#endif

	LWS_FOR_EVERY_AVAILABLE_ROLE_START(ar)
		if (ar->alpn && !strcmp(ar->alpn, alpn) &&
		    lws_rops_fidx(ar, LWS_ROPS_alpn_negotiated)) {
#if defined(LWS_WITH_SERVER)
			lws_metrics_tag_wsi_add(wsi, "upg", ar->name);
#endif
			return (lws_rops_func_fidx(ar, LWS_ROPS_alpn_negotiated)).
						   alpn_negotiated(wsi, alpn);
		}
	LWS_FOR_EVERY_AVAILABLE_ROLE_END;
#endif
	return 0;
}